

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

int __thiscall CGlyphMap::CAtlas::TrySection(CAtlas *this,int Index,int Width,int Height)

{
  int iVar1;
  vector3_base<int> *pvVar2;
  int iVar3;
  anon_union_4_4_d826a04f_for_vector3_base<int>_5 *paVar4;
  long lVar5;
  
  pvVar2 = (this->m_Sections).list;
  lVar5 = (long)Index;
  if (pvVar2[lVar5].field_0.x + Width < this->m_Width) {
    iVar3 = pvVar2[lVar5].field_1.y;
    iVar1 = (this->m_Sections).num_elements;
    if (0 < Width && Index < iVar1) {
      paVar4 = &pvVar2[lVar5].field_2;
      do {
        lVar5 = lVar5 + 1;
        if (iVar3 < ((anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 *)(paVar4 + -1))->y) {
          iVar3 = ((anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 *)(paVar4 + -1))->y;
        }
        if (this->m_Height <= iVar3 + Height) goto LAB_00130580;
        if (iVar1 <= lVar5) {
          return iVar3;
        }
        Width = Width - paVar4->z;
        paVar4 = paVar4 + 3;
      } while (0 < Width);
    }
  }
  else {
LAB_00130580:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int CGlyphMap::CAtlas::TrySection(int Index, int Width, int Height)
{
	ivec3 Section = m_Sections[Index];
	int CurX = Section.x;
	int CurY = Section.y;

	int FitWidth = Width;

	if(CurX + Width > m_Width - 1)
		return -1;

	for(int i = Index; i < m_Sections.size(); ++i)
	{
		if(FitWidth <= 0)
			break;

		Section = m_Sections[i];
		if(Section.y > CurY)
			CurY = Section.y;
		if(CurY + Height > m_Height - 1)
			return -1;
		FitWidth -= Section.l;
	}

	return CurY;
}